

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O2

void __thiscall
Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
          (STDDeleter<void,_Diligent::IMemoryAllocator> *this,void *ptr)

{
  IMemoryAllocator *pIVar1;
  string msg;
  string local_30;
  
  pIVar1 = this->m_Allocator;
  if (pIVar1 == (IMemoryAllocator *)0x0) {
    FormatString<char[72]>
              (&local_30,
               (char (*) [72])
               "The deleter has been moved away or never initialized, and can\'t be used");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/STDAllocator.hpp"
               ,0xd1);
    std::__cxx11::string::~string((string *)&local_30);
    pIVar1 = this->m_Allocator;
  }
  (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,ptr);
  return;
}

Assistant:

void operator()(T* ptr) noexcept
    {
        VERIFY(m_Allocator != nullptr, "The deleter has been moved away or never initialized, and can't be used");
        Destruct(ptr);
        m_Allocator->Free(ptr);
    }